

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmGlobalGenerator *this_00;
  TargetType TVar3;
  string *psVar4;
  pointer ppcVar5;
  ostream *poVar6;
  pointer ppcVar7;
  cmGlobalGenerator *this_01;
  string fname;
  cmGeneratedFileStream fout;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream local_278;
  
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::__cxx11::string::string((string *)&local_2b8,(string *)psVar4);
  std::__cxx11::string::append((char *)&local_2b8);
  std::__cxx11::string::append((char *)&local_2b8);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_2b8,false,None);
  ppcVar1 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar5 = (this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1) {
    ppcVar2 = ((*ppcVar5)->GeneratorTargets).
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar7 = ((*ppcVar5)->GeneratorTargets).
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar2;
        ppcVar7 = ppcVar7 + 1) {
      this_00 = (cmGlobalGenerator *)*ppcVar7;
      this_01 = this_00;
      TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00);
      if (TVar3 != INTERFACE_LIBRARY) {
        WriteSummary(this_01,(cmGeneratorTarget *)this_00);
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_298,(cmGeneratorTarget *)this_00);
        poVar6 = std::operator<<((ostream *)&local_278,(string *)&local_298);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_298);
      }
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  std::__cxx11::string::~string((string *)&local_2b8);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  // Record all target directories in a central location.
  std::string fname = this->CMakeInstance->GetHomeOutputDirectory();
  fname += "/CMakeFiles";
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname);

  for (cmLocalGenerator* lg : this->LocalGenerators) {
    const std::vector<cmGeneratorTarget*>& tgts = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* tgt : tgts) {
      if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->WriteSummary(tgt);
      fout << tgt->GetSupportDirectory() << "\n";
    }
  }
}